

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::Generate
          (MessageGenerator *this,Printer *printer)

{
  ushort *puVar1;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar2;
  Options *pOVar3;
  FieldDescriptor *pFVar4;
  FieldGeneratorBase *pFVar5;
  OneofDescriptor *this_00;
  EnumDescriptor *descriptor;
  Descriptor *pDVar6;
  char *pcVar7;
  Descriptor **ppDVar8;
  size_t sVar9;
  AlphaNum *a;
  FieldDescriptor *field;
  AlphaNum *a_00;
  FieldDescriptor *descriptor_01;
  AlphaNum *a_01;
  int i;
  int iVar10;
  int index;
  csharp *pcVar11;
  AlphaNum *c;
  AlphaNum *in_R9;
  bool bVar12;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string_view text_22;
  string_view text_23;
  string_view text_24;
  string_view text_25;
  string_view input;
  string_view input_00;
  string_view text_26;
  string_view text_27;
  string_view text_28;
  string_view text_29;
  string_view text_30;
  string_view text_31;
  string_view text_32;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  EnumGenerator enumGenerator;
  string local_100;
  AlphaNum local_e0;
  string local_b0;
  AlphaNum local_90;
  AlphaNum local_60;
  FileDescriptor *descriptor_00;
  
  vars.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  vars.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  vars.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  class_name_abi_cxx11_((string *)&enumGenerator,this);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)&vars,(key_arg<char[11]> *)0x575cfb);
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&enumGenerator);
  std::__cxx11::string::~string((string *)&enumGenerator);
  SourceGeneratorBase::class_access_level_abi_cxx11_
            ((string *)&enumGenerator,&this->super_SourceGeneratorBase);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[13],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)&vars,(key_arg<char[13]> *)"access_level");
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&enumGenerator);
  std::__cxx11::string::~string((string *)&enumGenerator);
  pOVar3 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
  WriteMessageDocComment(printer,pOVar3,this->descriptor_);
  AddDeprecatedFlag(this,printer);
  AddSerializableAttribute(this,printer);
  text._M_str = "[global::System.Diagnostics.DebuggerDisplayAttribute(\"{ToString(),nq}\")]\n";
  text._M_len = 0x49;
  io::Printer::Print<>(printer,text);
  text_17._M_str = "$access_level$ sealed partial class $class_name$ : ";
  text_17._M_len = 0x33;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_17);
  bVar12 = this->has_extension_ranges_ != false;
  sVar9 = 0x1b;
  if (bVar12) {
    sVar9 = 0x25;
  }
  pcVar7 = "pb::IMessage<$class_name$>\n";
  if (bVar12) {
    pcVar7 = "pb::IExtendableMessage<$class_name$>\n";
  }
  text_18._M_str = pcVar7;
  text_18._M_len = sVar9;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_18);
  text_00._M_str = "#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n";
  text_00._M_len = 0x32;
  io::Printer::Print<>(printer,text_00);
  text_01._M_str = "    , pb::IBufferMessage\n";
  text_01._M_len = 0x19;
  io::Printer::Print<>(printer,text_01);
  text_02._M_str = "#endif\n";
  text_02._M_len = 7;
  io::Printer::Print<>(printer,text_02);
  text_03._M_str = "{\n";
  text_03._M_len = 2;
  io::Printer::Print<>(printer,text_03);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  text_19._M_str =
       "private static readonly pb::MessageParser<$class_name$> _parser = new pb::MessageParser<$class_name$>(() => new $class_name$());\n"
  ;
  text_19._M_len = 0x81;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_19);
  text_04._M_str = "private pb::UnknownFieldSet _unknownFields;\n";
  text_04._M_len = 0x2c;
  io::Printer::Print<>(printer,text_04);
  if (this->has_extension_ranges_ == true) {
    bVar12 = IsDescriptorProto(this->descriptor_->file_);
    pcVar7 = "private pb::ExtensionSet<$class_name$> _extensions;\n";
    if (bVar12) {
      pcVar7 = "internal pb::ExtensionSet<$class_name$> _extensions;\n";
    }
    text_20._M_str = pcVar7;
    text_20._M_len = (ulong)bVar12 + 0x34;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_20);
    text_21._M_str =
         "private pb::ExtensionSet<$class_name$> _Extensions { get { return _extensions; } }\n";
    text_21._M_len = 0x53;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_21);
  }
  for (iVar10 = 0; iVar10 < this->has_bit_field_count_; iVar10 = iVar10 + 1) {
    absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&enumGenerator,iVar10);
    absl::lts_20250127::StrCat_abi_cxx11_((string *)&local_e0,(lts_20250127 *)&enumGenerator,a);
    text_05._M_str = "private int _hasBits$i$;\n";
    text_05._M_len = 0x19;
    io::Printer::Print<char[2],std::__cxx11::string>
              (printer,text_05,(char (*) [2])0x64d832,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_22._M_str =
       "public static pb::MessageParser<$class_name$> Parser { get { return _parser; } }\n\n";
  text_22._M_len = 0x52;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_22);
  pDVar6 = this->descriptor_->containing_type_;
  if (pDVar6 == (Descriptor *)0x0) {
    GetReflectionClassName_abi_cxx11_(&local_100,(csharp *)this->descriptor_->file_,descriptor_00);
    enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
         (_func_int **)local_100._M_string_length;
    enumGenerator.super_SourceGeneratorBase.options_ = (Options *)local_100._M_dataplus._M_p;
    local_e0.piece_ = absl::lts_20250127::NullSafeStringView(".Descriptor.MessageTypes[");
    pDVar6 = this->descriptor_;
    ppDVar8 = &pDVar6->file_->message_types_;
    if (pDVar6->containing_type_ != (Descriptor *)0x0) {
      ppDVar8 = &pDVar6->containing_type_->nested_types_;
    }
    absl::lts_20250127::AlphaNum::AlphaNum(&local_90,(int)(((long)pDVar6 - (long)*ppDVar8) / 0xa0));
    local_60.piece_ = absl::lts_20250127::NullSafeStringView("]");
    c = &local_60;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_b0,(lts_20250127 *)&enumGenerator,&local_e0,&local_90,c,in_R9);
    pbVar2 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[20],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&vars,(key_arg<char[20]> *)"descriptor_accessor");
  }
  else {
    GetClassName_abi_cxx11_(&local_100,(csharp *)pDVar6,(Descriptor *)descriptor_00);
    enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
         (_func_int **)local_100._M_string_length;
    enumGenerator.super_SourceGeneratorBase.options_ = (Options *)local_100._M_dataplus._M_p;
    local_e0.piece_ = absl::lts_20250127::NullSafeStringView(".Descriptor.NestedTypes[");
    pDVar6 = this->descriptor_;
    ppDVar8 = &pDVar6->file_->message_types_;
    if (pDVar6->containing_type_ != (Descriptor *)0x0) {
      ppDVar8 = &pDVar6->containing_type_->nested_types_;
    }
    absl::lts_20250127::AlphaNum::AlphaNum(&local_90,(int)(((long)pDVar6 - (long)*ppDVar8) / 0xa0));
    local_60.piece_ = absl::lts_20250127::NullSafeStringView("]");
    c = &local_60;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_b0,(lts_20250127 *)&enumGenerator,&local_e0,&local_90,c,in_R9);
    pbVar2 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[20],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&vars,(key_arg<char[20]> *)"descriptor_accessor");
  }
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_100);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_23._M_str =
       "public static pbr::MessageDescriptor Descriptor {\n  get { return $descriptor_accessor$; }\n}\n\n"
  ;
  text_23._M_len = 0x5d;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_23);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_24._M_str =
       "pbr::MessageDescriptor pb::IMessage.Descriptor {\n  get { return Descriptor; }\n}\n\n";
  text_24._M_len = 0x51;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_24);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_25._M_str =
       "public $class_name$() {\n  OnConstruction();\n}\n\npartial void OnConstruction();\n\n";
  text_25._M_len = 0x4f;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_25);
  GenerateCloningCode(this,printer);
  for (iVar10 = 0; pDVar6 = this->descriptor_, iVar10 < pDVar6->field_count_; iVar10 = iVar10 + 1) {
    pFVar4 = Descriptor::field(pDVar6,iVar10);
    puVar1 = (ushort *)(pFVar4->all_names_).payload_;
    local_60.piece_._M_len = (size_t)*puVar1;
    local_60.piece_._M_str = (char *)((long)puVar1 + ~local_60.piece_._M_len);
    GetFieldConstantName_abi_cxx11_((string *)&local_e0,(csharp *)pFVar4,field);
    absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&enumGenerator,pFVar4->number_);
    absl::lts_20250127::StrCat_abi_cxx11_((string *)&local_90,(lts_20250127 *)&enumGenerator,a_00);
    c = &local_60;
    text_06._M_str =
         "/// <summary>Field number for the \"$field_name$\" field.</summary>\npublic const int $field_constant_name$ = $index$;\n"
    ;
    text_06._M_len = 0x74;
    io::Printer::
    Print<char[11],std::basic_string_view<char,std::char_traits<char>>,char[20],std::__cxx11::string,char[6],std::__cxx11::string>
              (printer,text_06,(char (*) [11])0x501fba,&c->piece_,
               (char (*) [20])"field_constant_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0,
               (char (*) [6])0x41e1cd,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_e0);
    pFVar5 = CreateFieldGeneratorInternal(this,pFVar4);
    (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[6])(pFVar5,printer);
    text_07._M_str = "\n";
    text_07._M_len = 1;
    io::Printer::Print<>(printer,text_07);
    (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar5);
  }
  for (iVar10 = 0; iVar10 < pDVar6->real_oneof_decl_count_; iVar10 = iVar10 + 1) {
    this_00 = Descriptor::oneof_decl(pDVar6,iVar10);
    puVar1 = (ushort *)(this_00->all_names_).payload_;
    pcVar11 = (csharp *)(ulong)*puVar1;
    input._M_len = (long)puVar1 + ~(ulong)pcVar11;
    input._M_str = (char *)0x0;
    UnderscoresToCamelCase_abi_cxx11_((string *)&enumGenerator,pcVar11,input,SUB81(c,0));
    pbVar2 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&vars,(key_arg<char[5]> *)0x651c1c);
    std::__cxx11::string::operator=((string *)pbVar2,(string *)&enumGenerator);
    std::__cxx11::string::~string((string *)&enumGenerator);
    puVar1 = (ushort *)(this_00->all_names_).payload_;
    pcVar11 = (csharp *)(ulong)*puVar1;
    input_00._M_len = (long)puVar1 + ~(ulong)pcVar11;
    input_00._M_str = (char *)0x1;
    UnderscoresToCamelCase_abi_cxx11_((string *)&enumGenerator,pcVar11,input_00,SUB81(c,0));
    pbVar2 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[14],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&vars,(key_arg<char[14]> *)0x552156);
    std::__cxx11::string::operator=((string *)pbVar2,(string *)&enumGenerator);
    std::__cxx11::string::~string((string *)&enumGenerator);
    puVar1 = (ushort *)(this_00->all_names_).payload_;
    local_e0.piece_._M_len = (size_t)*puVar1;
    local_e0.piece_._M_str = (char *)((long)puVar1 + ~local_e0.piece_._M_len);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&enumGenerator,&local_e0.piece_,(allocator<char> *)&local_90);
    pbVar2 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[14],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&vars,(key_arg<char[14]> *)"original_name");
    std::__cxx11::string::operator=((string *)pbVar2,(string *)&enumGenerator);
    std::__cxx11::string::~string((string *)&enumGenerator);
    text_26._M_str =
         "private object $name$_;\n/// <summary>Enum of possible cases for the \"$original_name$\" oneof.</summary>\npublic enum $property_name$OneofCase {\n"
    ;
    text_26._M_len = 0x8e;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_26);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    text_08._M_str = "None = 0,\n";
    text_08._M_len = 10;
    io::Printer::Print<>(printer,text_08);
    for (index = 0; index < this_00->field_count_; index = index + 1) {
      pFVar4 = OneofDescriptor::field(this_00,index);
      GetOneofCaseName_abi_cxx11_((string *)&local_e0,(csharp *)pFVar4,descriptor_01);
      absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&enumGenerator,pFVar4->number_);
      absl::lts_20250127::StrCat_abi_cxx11_((string *)&local_90,(lts_20250127 *)&enumGenerator,a_01)
      ;
      text_09._M_str = "$oneof_case_name$ = $index$,\n";
      text_09._M_len = 0x1d;
      c = &local_e0;
      io::Printer::Print<char[16],std::__cxx11::string,char[6],std::__cxx11::string>
                (printer,text_09,(char (*) [16])"oneof_case_name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0,
                 (char (*) [6])0x41e1cd,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    io::Printer::Outdent(printer);
    text_10._M_str = "}\n";
    text_10._M_len = 2;
    io::Printer::Print<>(printer,text_10);
    text_27._M_str =
         "private $property_name$OneofCase $name$Case_ = $property_name$OneofCase.None;\n";
    text_27._M_len = 0x4e;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_27);
    SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
    text_28._M_str =
         "public $property_name$OneofCase $property_name$Case {\n  get { return $name$Case_; }\n}\n\n"
    ;
    text_28._M_len = 0x57;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_28);
    SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
    text_29._M_str =
         "public void Clear$property_name$() {\n  $name$Case_ = $property_name$OneofCase.None;\n  $name$_ = null;\n}\n\n"
    ;
    text_29._M_len = 0x69;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_29);
    pDVar6 = this->descriptor_;
  }
  GenerateFrameworkMethods(this,printer);
  GenerateMessageSerializationMethods(this,printer);
  GenerateMergingMethods(this,printer);
  if (this->has_extension_ranges_ == true) {
    text_30._M_str =
         "public TValue GetExtension<TValue>(pb::Extension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.Get(ref _extensions, extension);\n}\npublic pbc::RepeatedField<TValue> GetExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.Get(ref _extensions, extension);\n}\npublic pbc::RepeatedField<TValue> GetOrInitializeExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.GetOrInitialize(ref _extensions, extension);\n}\npublic void SetExtension<TValue>(pb::Extension<$class_name$, TValue> extension, TValue value) {\n  pb::ExtensionSet.Set(ref _extensions, extension, value);\n}\npublic bool HasExtension<TValue>(pb::Extension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.Has(ref _extensions, extension);\n}\npublic void ClearExtension<TValue>(pb::Extension<$class_name$, TValue> extension) {\n  pb::ExtensionSet.Clear(ref _extensions, extension);\n}\npublic void ClearExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> extension) {\n  pb::ExtensionSet.Clear(ref _extensions, extension);\n}\n\n"
    ;
    text_30._M_len = 0x450;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_30);
  }
  bVar12 = HasNestedGeneratedTypes(this);
  if (bVar12) {
    text_31._M_str =
         "#region Nested types\n/// <summary>Container for nested types declared in the $class_name$ message type.</summary>\n"
    ;
    text_31._M_len = 0x72;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_31);
    SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
    text_11._M_str = "public static partial class Types {\n";
    text_11._M_len = 0x24;
    io::Printer::Print<>(printer,text_11);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    for (iVar10 = 0; pDVar6 = this->descriptor_, iVar10 < pDVar6->enum_type_count_;
        iVar10 = iVar10 + 1) {
      descriptor = Descriptor::enum_type(pDVar6,iVar10);
      pOVar3 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
      EnumGenerator::EnumGenerator(&enumGenerator,descriptor,pOVar3);
      EnumGenerator::Generate(&enumGenerator,printer);
      EnumGenerator::~EnumGenerator(&enumGenerator);
    }
    for (iVar10 = 0; iVar10 < pDVar6->nested_type_count_; iVar10 = iVar10 + 1) {
      pDVar6 = Descriptor::nested_type(pDVar6,iVar10);
      if ((pDVar6->options_->field_0)._impl_.map_entry_ == false) {
        pDVar6 = Descriptor::nested_type(this->descriptor_,iVar10);
        pOVar3 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
        MessageGenerator((MessageGenerator *)&enumGenerator,pDVar6,pOVar3);
        Generate((MessageGenerator *)&enumGenerator,printer);
        ~MessageGenerator((MessageGenerator *)&enumGenerator);
      }
      pDVar6 = this->descriptor_;
    }
    io::Printer::Outdent(printer);
    text_12._M_str = "}\n#endregion\n\n";
    text_12._M_len = 0xe;
    io::Printer::Print<>(printer,text_12);
  }
  if (0 < this->descriptor_->extension_count_) {
    text_32._M_str =
         "#region Extensions\n/// <summary>Container for extensions for other messages declared in the $class_name$ message type.</summary>\n"
    ;
    text_32._M_len = 0x81;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_32);
    SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
    text_13._M_str = "public static partial class Extensions {\n";
    text_13._M_len = 0x29;
    io::Printer::Print<>(printer,text_13);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    for (iVar10 = 0; iVar10 < this->descriptor_->extension_count_; iVar10 = iVar10 + 1) {
      pFVar4 = Descriptor::extension(this->descriptor_,iVar10);
      pFVar5 = CreateFieldGeneratorInternal(this,pFVar4);
      (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[5])(pFVar5,printer);
      (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar5);
    }
    io::Printer::Outdent(printer);
    text_14._M_str = "}\n#endregion\n\n";
    text_14._M_len = 0xe;
    io::Printer::Print<>(printer,text_14);
  }
  io::Printer::Outdent(printer);
  text_15._M_str = "}\n";
  text_15._M_len = 2;
  io::Printer::Print<>(printer,text_15);
  text_16._M_str = "\n";
  text_16._M_len = 1;
  io::Printer::Print<>(printer,text_16);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&vars);
  return;
}

Assistant:

void MessageGenerator::Generate(io::Printer* printer) {
  absl::flat_hash_map<absl::string_view, std::string> vars;
  vars["class_name"] = class_name();
  vars["access_level"] = class_access_level();

  WriteMessageDocComment(printer, options(), descriptor_);
  AddDeprecatedFlag(printer);
  AddSerializableAttribute(printer);

  printer->Print(
      "[global::System.Diagnostics.DebuggerDisplayAttribute(\"{ToString(),nq}"
      "\")]\n");
  printer->Print(vars, "$access_level$ sealed partial class $class_name$ : ");

  if (has_extension_ranges_) {
    printer->Print(vars, "pb::IExtendableMessage<$class_name$>\n");
  } else {
    printer->Print(vars, "pb::IMessage<$class_name$>\n");
  }
  printer->Print("#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  printer->Print("    , pb::IBufferMessage\n");
  printer->Print("#endif\n");
  printer->Print("{\n");
  printer->Indent();

  // All static fields and properties
  printer->Print(
      vars,
      "private static readonly pb::MessageParser<$class_name$> _parser = new "
      "pb::MessageParser<$class_name$>(() => new $class_name$());\n");

  printer->Print("private pb::UnknownFieldSet _unknownFields;\n");

  if (has_extension_ranges_) {
    if (IsDescriptorProto(descriptor_->file())) {
      printer->Print(vars,
                     // CustomOptions compatibility
                     "internal pb::ExtensionSet<$class_name$> _extensions;\n");
    } else {
      printer->Print(vars,
                     "private pb::ExtensionSet<$class_name$> _extensions;\n");
    }

    // a read-only property for fast
    // retrieval of the set in IsInitialized
    printer->Print(vars,
                   "private pb::ExtensionSet<$class_name$> _Extensions { get { "
                   "return _extensions; } }\n");
  }

  for (int i = 0; i < has_bit_field_count_; i++) {
    // don't use arrays since all arrays are heap allocated, saving allocations
    // use ints instead of bytes since bytes lack bitwise operators, saving
    // casts
    printer->Print("private int _hasBits$i$;\n", "i", absl::StrCat(i));
  }

  WriteGeneratedCodeAttributes(printer);

  printer->Print(vars,
                 "public static pb::MessageParser<$class_name$> Parser { get { "
                 "return _parser; } }\n\n");

  // Access the message descriptor via the relevant file descriptor or
  // containing message descriptor.
  if (!descriptor_->containing_type()) {
    vars["descriptor_accessor"] =
        absl::StrCat(GetReflectionClassName(descriptor_->file()),
                     ".Descriptor.MessageTypes[", descriptor_->index(), "]");
  } else {
    vars["descriptor_accessor"] =
        absl::StrCat(GetClassName(descriptor_->containing_type()),
                     ".Descriptor.NestedTypes[", descriptor_->index(), "]");
  }

  WriteGeneratedCodeAttributes(printer);
  printer->Print(vars,
                 "public static pbr::MessageDescriptor Descriptor {\n"
                 "  get { return $descriptor_accessor$; }\n"
                 "}\n"
                 "\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print(vars,
                 "pbr::MessageDescriptor pb::IMessage.Descriptor {\n"
                 "  get { return Descriptor; }\n"
                 "}\n"
                 "\n");

  // Parameterless constructor and partial OnConstruction method.
  WriteGeneratedCodeAttributes(printer);
  printer->Print(vars,
                 "public $class_name$() {\n"
                 "  OnConstruction();\n"
                 "}\n\n"
                 "partial void OnConstruction();\n\n");

  GenerateCloningCode(printer);
  GenerateFreezingCode(printer);

  // Fields/properties
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* fieldDescriptor = descriptor_->field(i);

    // Rats: we lose the debug comment here :(
    printer->Print(
        "/// <summary>Field number for the \"$field_name$\" field.</summary>\n"
        "public const int $field_constant_name$ = $index$;\n",
        "field_name", fieldDescriptor->name(), "field_constant_name",
        GetFieldConstantName(fieldDescriptor), "index",
        absl::StrCat(fieldDescriptor->number()));
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(fieldDescriptor));
    generator->GenerateMembers(printer);
    printer->Print("\n");
  }

  // oneof properties (for real oneofs, which come before synthetic ones)
  for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    vars["name"] = UnderscoresToCamelCase(oneof->name(), false);
    vars["property_name"] = UnderscoresToCamelCase(oneof->name(), true);
    vars["original_name"] = std::string(oneof->name());
    printer->Print(vars,
                   "private object $name$_;\n"
                   "/// <summary>Enum of possible cases for the "
                   "\"$original_name$\" oneof.</summary>\n"
                   "public enum $property_name$OneofCase {\n");
    printer->Indent();
    printer->Print("None = 0,\n");
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print("$oneof_case_name$ = $index$,\n", "oneof_case_name",
                     GetOneofCaseName(field), "index",
                     absl::StrCat(field->number()));
    }
    printer->Outdent();
    printer->Print("}\n");
    // TODO: Should we put the oneof .proto comments here?
    // It's unclear exactly where they should go.
    printer->Print(vars,
                   "private $property_name$OneofCase $name$Case_ = "
                   "$property_name$OneofCase.None;\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print(vars,
                   "public $property_name$OneofCase $property_name$Case {\n"
                   "  get { return $name$Case_; }\n"
                   "}\n\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print(vars,
                   "public void Clear$property_name$() {\n"
                   "  $name$Case_ = $property_name$OneofCase.None;\n"
                   "  $name$_ = null;\n"
                   "}\n\n");
  }

  // Standard methods
  GenerateFrameworkMethods(printer);
  GenerateMessageSerializationMethods(printer);
  GenerateMergingMethods(printer);

  if (has_extension_ranges_) {
    printer->Print(
        vars,
        "public TValue GetExtension<TValue>(pb::Extension<$class_name$, "
        "TValue> extension) {\n"
        "  return pb::ExtensionSet.Get(ref _extensions, extension);\n"
        "}\n"
        "public pbc::RepeatedField<TValue> "
        "GetExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> "
        "extension) {\n"
        "  return pb::ExtensionSet.Get(ref _extensions, extension);\n"
        "}\n"
        "public pbc::RepeatedField<TValue> "
        "GetOrInitializeExtension<TValue>(pb::RepeatedExtension<$class_name$, "
        "TValue> extension) {\n"
        "  return pb::ExtensionSet.GetOrInitialize(ref _extensions, "
        "extension);\n"
        "}\n"
        "public void SetExtension<TValue>(pb::Extension<$class_name$, TValue> "
        "extension, TValue value) {\n"
        "  pb::ExtensionSet.Set(ref _extensions, extension, value);\n"
        "}\n"
        "public bool HasExtension<TValue>(pb::Extension<$class_name$, TValue> "
        "extension) {\n"
        "  return pb::ExtensionSet.Has(ref _extensions, extension);\n"
        "}\n"
        "public void ClearExtension<TValue>(pb::Extension<$class_name$, "
        "TValue> extension) {\n"
        "  pb::ExtensionSet.Clear(ref _extensions, extension);\n"
        "}\n"
        "public void "
        "ClearExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> "
        "extension) {\n"
        "  pb::ExtensionSet.Clear(ref _extensions, extension);\n"
        "}\n\n");
  }

  // Nested messages and enums
  if (HasNestedGeneratedTypes()) {
    printer->Print(vars,
                   "#region Nested types\n"
                   "/// <summary>Container for nested types declared in the "
                   "$class_name$ message type.</summary>\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print("public static partial class Types {\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->enum_type_count(); i++) {
      EnumGenerator enumGenerator(descriptor_->enum_type(i), this->options());
      enumGenerator.Generate(printer);
    }
    for (int i = 0; i < descriptor_->nested_type_count(); i++) {
      // Don't generate nested types for maps...
      if (!IsMapEntryMessage(descriptor_->nested_type(i))) {
        MessageGenerator messageGenerator(descriptor_->nested_type(i),
                                          this->options());
        messageGenerator.Generate(printer);
      }
    }
    printer->Outdent();
    printer->Print(
        "}\n"
        "#endregion\n"
        "\n");
  }

  if (descriptor_->extension_count() > 0) {
    printer->Print(vars,
                   "#region Extensions\n"
                   "/// <summary>Container for extensions for other messages "
                   "declared in the $class_name$ message type.</summary>\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print("public static partial class Extensions {\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->extension_count(); i++) {
      std::unique_ptr<FieldGeneratorBase> generator(
          CreateFieldGeneratorInternal(descriptor_->extension(i)));
      generator->GenerateExtensionCode(printer);
    }
    printer->Outdent();
    printer->Print(
        "}\n"
        "#endregion\n"
        "\n");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Print("\n");
}